

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void forget_single_object(int obj_id)

{
  int obj_id_local;
  
  objects[obj_id].field_0x10 = objects[obj_id].field_0x10 & 0xfe;
  objects[obj_id].field_0x10 = objects[obj_id].field_0x10 & 0xf7;
  if (objects[obj_id].oc_uname != (char *)0x0) {
    free(objects[obj_id].oc_uname);
    objects[obj_id].oc_uname = (char *)0x0;
  }
  undiscover_object(obj_id);
  if (((obj_id < 0x5f) || (0x69 < obj_id)) || ((objects[obj_id + -0xb].field_0x10 & 1) == 0)) {
    if (((0x53 < obj_id) && (obj_id < 0x5f)) && ((objects[obj_id + 0xb].field_0x10 & 1) != 0)) {
      forget_single_object(obj_id + 0xb);
    }
  }
  else {
    forget_single_object(obj_id + -0xb);
  }
  return;
}

Assistant:

static void forget_single_object(int obj_id)
{
	objects[obj_id].oc_name_known = 0;
	objects[obj_id].oc_pre_discovered = 0;	/* a discovery when relearned */
	if (objects[obj_id].oc_uname) {
	    free(objects[obj_id].oc_uname);
	    objects[obj_id].oc_uname = 0;
	}
	undiscover_object(obj_id);	/* after clearing oc_name_known */

	if (Is_dragon_scales(obj_id) &&
	    objects[Dragon_scales_to_mail(obj_id)].oc_name_known) {
	    forget_single_object(Dragon_scales_to_mail(obj_id));
	} else if (Is_dragon_mail(obj_id) &&
		   objects[Dragon_mail_to_scales(obj_id)].oc_name_known) {
	    forget_single_object(Dragon_mail_to_scales(obj_id));
	}
	/* clear & free object names from matching inventory items too? */
}